

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

string * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (string *__return_storage_ptr__,Json *this,char *value,uint length)

{
  Json *pJVar1;
  Json JVar2;
  char cVar3;
  long *plVar4;
  undefined4 in_register_0000000c;
  char *pcVar5;
  long *plVar6;
  size_type *psVar7;
  int iVar8;
  Json *pJVar9;
  Json *pJVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  ostringstream oss;
  undefined1 auStack_1d8 [8];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long alStack_190 [11];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  pcVar5 = (char *)CONCAT44(in_register_0000000c,length);
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","",pcVar5);
    return __return_storage_ptr__;
  }
  iVar8 = (int)value;
  pcVar12 = (char *)((ulong)value & 0xffffffff);
  if (iVar8 != 0) {
    pcVar5 = "\"\\\b\f\n\r\t";
    pJVar10 = this;
    do {
      if (*pJVar10 == (Json)0x22) {
        bVar13 = false;
        pJVar9 = pJVar10;
      }
      else {
        lVar11 = 1;
        do {
          pJVar1 = (Json *)("\"\\\b\f\n\r\t" + lVar11);
          pJVar9 = (Json *)value;
          if (lVar11 == 7) break;
          lVar11 = lVar11 + 1;
          pJVar9 = pJVar10;
        } while (*pJVar1 != *pJVar10);
        bVar13 = *pJVar1 == (Json)0x0;
      }
      if (!bVar13) goto LAB_001104a2;
      pJVar10 = pJVar10 + 1;
      value = (char *)pJVar9;
    } while (pJVar10 < this + (long)pcVar12);
    pJVar9 = (Json *)0x0;
LAB_001104a2:
    if (pJVar9 != (Json *)0x0) goto LAB_001104d5;
  }
  bVar13 = iVar8 != 0;
  if ((bVar13) && (0x1f < (byte)*this)) {
    pcVar5 = (char *)0x1;
    do {
      bVar13 = pcVar12 != pcVar5;
      if (pcVar12 == pcVar5) break;
      pJVar10 = this + (long)pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (0x1f < (byte)*pJVar10);
  }
  if (!bVar13) {
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"\"","",pcVar5);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_1d0);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_198 = *plVar6;
      alStack_190[0] = plVar4[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar6;
      local_1a8 = (long *)*plVar4;
    }
    local_1a0 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar11 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar11;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8);
    }
    if (local_1d0[0] == local_1c0) {
      return __return_storage_ptr__;
    }
    operator_delete(local_1d0[0]);
    return __return_storage_ptr__;
  }
LAB_001104d5:
  local_1b0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (iVar8 != 0) {
    pcVar5 = (char *)0x0;
    do {
      JVar2 = this[(long)pcVar5];
      switch(JVar2) {
      case (Json)0x8:
        break;
      case (Json)0x9:
        break;
      case (Json)0xa:
        break;
      case (Json)0xb:
switchD_00110536_caseD_b:
        if ((byte)JVar2 < 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\\u",2);
          *(uint *)((long)alStack_190 + local_1a8[-3]) =
               *(uint *)((long)alStack_190 + local_1a8[-3]) & 0xffffffb5 | 8;
          *(uint *)((long)alStack_190 + local_1a8[-3]) =
               *(uint *)((long)alStack_190 + local_1a8[-3]) | 0x4000;
          lVar11 = local_1a8[-3];
          if (acStack_c8[lVar11 + 1] == '\0') {
            cVar3 = std::ios::widen((char)auStack_1d8 + (char)lVar11 + '0');
            acStack_c8[lVar11] = cVar3;
            acStack_c8[lVar11 + 1] = '\x01';
          }
          acStack_c8[lVar11] = '0';
          *(undefined8 *)((long)alStack_190 + local_1a8[-3] + -8) = 4;
          std::ostream::operator<<(&local_1a8,(int)(char)this[(long)pcVar5]);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d0[0]);
          if (local_1d0[0] != local_1c0) {
            operator_delete(local_1d0[0]);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        goto LAB_00110687;
      case (Json)0xc:
        break;
      case (Json)0xd:
        break;
      default:
        if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_00110536_caseD_b;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00110687:
      pcVar5 = pcVar5 + 1;
    } while (pcVar12 != pcVar5);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static JSONCPP_STRING valueToQuotedStringN(const char* value, unsigned length) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strnpbrk(value, "\"\\\b\f\n\r\t", length) == NULL &&
      !containsControlCharacter0(value, length))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      length * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if ((isControlCharacter(*c)) || (*c == 0)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}